

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

ParamType *
testing::WithParamInterface<std::basic_string_view<char,_std::char_traits<char>_>_>::GetParam(void)

{
  bool bVar1;
  GTestLog local_c;
  
  bVar1 = testing::internal::IsTrue
                    (WithParamInterface<std::basic_string_view<char,std::char_traits<char>>>::
                     parameter_ != (ParamType *)0x0);
  if (!bVar1) {
    testing::internal::GTestLog::GTestLog
              (&local_c,GTEST_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/gtest.h"
               ,0x6a1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition parameter_ != nullptr failed. ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "GetParam() can only be called inside a value-parameterized test ",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"-- did you intend to write TEST_P instead of TEST_F?",0x34);
    testing::internal::GTestLog::~GTestLog(&local_c);
  }
  return WithParamInterface<std::basic_string_view<char,std::char_traits<char>>>::parameter_;
}

Assistant:

static const ParamType& GetParam() {
    GTEST_CHECK_(parameter_ != nullptr)
        << "GetParam() can only be called inside a value-parameterized test "
        << "-- did you intend to write TEST_P instead of TEST_F?";
    return *parameter_;
  }